

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csoaa.cc
# Opt level: O3

multi_ex * CSOAA::process_labels(multi_ex *__return_storage_ptr__,ldf *data,multi_ex *ec_seq_all)

{
  pointer *pppeVar1;
  float fVar2;
  example *peVar3;
  iterator __position;
  bool bVar4;
  ulong uVar5;
  wclass *pwVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  size_t j;
  features *pfVar10;
  features *pfVar11;
  pointer ppeVar12;
  ulong uVar13;
  byte bVar14;
  features new_fs;
  pointer local_b0;
  features local_98;
  
  bVar14 = 0;
  ppeVar12 = (ec_seq_all->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  peVar3 = *ppeVar12;
  bVar4 = ec_is_label_definition(peVar3);
  if (bVar4) {
    pfVar10 = (peVar3->super_example_predict).feature_space +
              *(peVar3->super_example_predict).indices._begin;
    pfVar11 = &local_98;
    for (lVar8 = 0xd; lVar8 != 0; lVar8 = lVar8 + -1) {
      (pfVar11->values)._begin = (pfVar10->values)._begin;
      pfVar10 = (features *)((long)pfVar10 + ((ulong)bVar14 * -2 + 1) * 8);
      pfVar11 = (features *)((long)pfVar11 + ((ulong)bVar14 * -2 + 1) * 8);
    }
    pwVar6 = (peVar3->l).cs.costs._begin;
    if ((peVar3->l).cs.costs._end != pwVar6) {
      lVar8 = 0;
      uVar13 = 0;
      do {
        fVar2 = *(float *)((long)&pwVar6->x + lVar8);
        uVar5 = (ulong)fVar2;
        LabelDict::set_label_features
                  (&data->label_features,(long)(fVar2 - 9.223372e+18) & (long)uVar5 >> 0x3f | uVar5,
                   &local_98);
        uVar13 = uVar13 + 1;
        pwVar6 = (peVar3->l).cs.costs._begin;
        lVar8 = lVar8 + 0x10;
      } while (uVar13 < (ulong)((long)(peVar3->l).cs.costs._end - (long)pwVar6 >> 4));
      ppeVar12 = (ec_seq_all->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                 super__Vector_impl_data._M_start;
    }
    (__return_storage_ptr__->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_b0 = (ec_seq_all->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
               super__Vector_impl_data._M_finish;
    if (8 < (ulong)((long)local_b0 - (long)ppeVar12)) {
      uVar13 = 1;
      lVar8 = 8;
      do {
        peVar3 = ppeVar12[uVar13];
        bVar4 = ec_is_label_definition(peVar3);
        if (!bVar4) {
          if ((ulong)((long)local_b0 - (long)ppeVar12 >> 3) <= uVar13) {
            return __return_storage_ptr__;
          }
          do {
            __position._M_current =
                 (__return_storage_ptr__->super__Vector_base<example_*,_std::allocator<example_*>_>)
                 ._M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (__return_storage_ptr__->super__Vector_base<example_*,_std::allocator<example_*>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<example*,std::allocator<example*>>::_M_realloc_insert<example*const&>
                        ((vector<example*,std::allocator<example*>> *)__return_storage_ptr__,
                         __position,(example **)((long)ppeVar12 + lVar8));
            }
            else {
              *__position._M_current = *(example **)((long)ppeVar12 + lVar8);
              pppeVar1 = &(__return_storage_ptr__->
                          super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl.
                          super__Vector_impl_data._M_finish;
              *pppeVar1 = *pppeVar1 + 1;
            }
            uVar13 = uVar13 + 1;
            ppeVar12 = (ec_seq_all->super__Vector_base<example_*,_std::allocator<example_*>_>).
                       _M_impl.super__Vector_impl_data._M_start;
            lVar8 = lVar8 + 8;
          } while (uVar13 < (ulong)((long)(ec_seq_all->
                                          super__Vector_base<example_*,_std::allocator<example_*>_>)
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)ppeVar12 >> 3));
          return __return_storage_ptr__;
        }
        pfVar10 = (peVar3->super_example_predict).feature_space +
                  *(peVar3->super_example_predict).indices._begin;
        pfVar11 = &local_98;
        for (lVar9 = 0xd; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pfVar11->values)._begin = (pfVar10->values)._begin;
          pfVar10 = (features *)((long)pfVar10 + ((ulong)bVar14 * -2 + 1) * 8);
          pfVar11 = (features *)((long)pfVar11 + (ulong)bVar14 * -0x10 + 8);
        }
        pwVar6 = (peVar3->l).cs.costs._begin;
        if ((peVar3->l).cs.costs._end != pwVar6) {
          lVar9 = 0;
          uVar5 = 0;
          do {
            fVar2 = *(float *)((long)&pwVar6->x + lVar9);
            uVar7 = (ulong)fVar2;
            LabelDict::set_label_features
                      (&data->label_features,
                       (long)(fVar2 - 9.223372e+18) & (long)uVar7 >> 0x3f | uVar7,&local_98);
            uVar5 = uVar5 + 1;
            pwVar6 = (peVar3->l).cs.costs._begin;
            lVar9 = lVar9 + 0x10;
          } while (uVar5 < (ulong)((long)(peVar3->l).cs.costs._end - (long)pwVar6 >> 4));
          ppeVar12 = (ec_seq_all->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl
                     .super__Vector_impl_data._M_start;
          local_b0 = (ec_seq_all->super__Vector_base<example_*,_std::allocator<example_*>_>)._M_impl
                     .super__Vector_impl_data._M_finish;
        }
        uVar13 = uVar13 + 1;
        lVar8 = lVar8 + 8;
      } while (uVar13 < (ulong)((long)local_b0 - (long)ppeVar12 >> 3));
    }
  }
  else {
    std::vector<example_*,_std::allocator<example_*>_>::vector(__return_storage_ptr__,ec_seq_all);
  }
  return __return_storage_ptr__;
}

Assistant:

multi_ex process_labels(ldf& data, const multi_ex& ec_seq_all)
{
  example* ec = ec_seq_all[0];

  // check the first element, if it's not a label, return
  if (!ec_is_label_definition(*ec))
    return ec_seq_all;

  // process the first element as a label
  process_label(data, ec);

  multi_ex ret;
  size_t i = 1;
  // process the rest of the elements that are labels
  for (; i < ec_seq_all.size(); i++)
  {
    ec = ec_seq_all[i];
    if (!ec_is_label_definition(*ec))
    {
      for (size_t j = i; j < ec_seq_all.size(); j++) ret.push_back(ec_seq_all[j]);
      // return index of the first element that is not a label
      return ret;
    }

    process_label(data, ec);
  }

  // all examples were labels return size
  return ret;
}